

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VScaleVectorArray_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  int in_EDI;
  sunrealtype *zd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffc0;
  N_Vector in_stack_ffffffffffffffc8;
  long lVar3;
  long lVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  
  if (in_EDI == 1) {
    N_VScale_Serial((sunrealtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    lVar1 = **(long **)*in_RCX;
    if (in_RDX == in_RCX) {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RDX[iVar5] + 0x10);
        for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
          *(double *)(lVar2 + lVar3 * 8) =
               *(double *)(in_RSI + (long)iVar5 * 8) * *(double *)(lVar2 + lVar3 * 8);
        }
      }
    }
    else {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RDX[iVar5] + 0x10);
        lVar3 = *(long *)(*(long *)in_RCX[iVar5] + 0x10);
        for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
          *(double *)(lVar3 + lVar4 * 8) =
               *(double *)(in_RSI + (long)iVar5 * 8) * *(double *)(lVar2 + lVar4 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleVectorArray_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                      N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { xd[j] *= c[i]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}